

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::
BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
::occluded(BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMvMBIntersector1Moeller<4,_true>_>_>
           *this,Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  undefined4 uVar13;
  Collider CVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  AABBNodeMB4D *node1;
  undefined1 *puVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float fVar27;
  float fVar29;
  float fVar30;
  undefined1 auVar28 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar39;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar40;
  float fVar45;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint uVar52;
  float fVar53;
  float fVar54;
  uint uVar55;
  float fVar56;
  uint uVar57;
  float fVar58;
  uint uVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  uint uVar68;
  float fVar69;
  float fVar70;
  uint uVar71;
  float fVar72;
  uint uVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_9fc;
  undefined8 local_9f8;
  float fStack_9f0;
  float fStack_9ec;
  byte *local_9e0;
  RayQueryContext *local_9d8;
  Ray *local_9d0;
  undefined1 local_9c8 [16];
  long local_9b8;
  long local_9b0;
  long local_9a8;
  ulong local_9a0;
  ulong *local_998;
  ulong local_990;
  float local_988;
  float local_984;
  float local_980;
  float local_97c;
  float local_978;
  undefined4 local_974;
  uint local_970;
  undefined4 local_96c;
  undefined4 local_968;
  int *local_958;
  undefined8 local_950;
  undefined4 *local_948;
  Intersectors *local_940;
  float *local_938;
  undefined4 local_930;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_848 [16];
  float local_838 [4];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  float local_7f8 [4];
  float local_7e8 [4];
  ulong local_7d8 [245];
  
  if ((*(ulong *)(*(long *)this + 0x70) != 8) &&
     (fVar74 = *(float *)&(This->intersector1).intersect, 0.0 <= fVar74)) {
    local_9d0 = ray;
    local_998 = local_7d8 + 1;
    local_7d8[0] = *(ulong *)(*(long *)this + 0x70);
    fVar75 = *(float *)&This->ptr;
    fVar76 = *(float *)((long)&This->ptr + 4);
    fVar77 = *(float *)&This->leafIntersector;
    fVar53 = *(float *)((long)&This->leafIntersector + 4);
    CVar14 = This->collider;
    fVar60 = 0.0;
    if (0.0 <= fVar53) {
      fVar60 = fVar53;
    }
    auVar28._4_4_ = -(uint)(ABS(CVar14.collide._4_4_) < DAT_01f4bd50._4_4_);
    auVar28._0_4_ = -(uint)(ABS(CVar14.collide._0_4_) < (float)DAT_01f4bd50);
    auVar28._8_4_ = -(uint)(ABS(CVar14.name._0_4_) < DAT_01f4bd50._8_4_);
    auVar28._12_4_ = -(uint)(ABS(CVar14.name._4_4_) < DAT_01f4bd50._12_4_);
    auVar35 = blendvps((undefined1  [16])CVar14,_DAT_01f4bd50,auVar28);
    auVar28 = rcpps(auVar28,auVar35);
    fVar64 = auVar28._0_4_;
    fVar66 = auVar28._4_4_;
    fVar69 = auVar28._8_4_;
    fVar64 = (1.0 - auVar35._0_4_ * fVar64) * fVar64 + fVar64;
    fVar66 = (1.0 - auVar35._4_4_ * fVar66) * fVar66 + fVar66;
    fVar69 = (1.0 - auVar35._8_4_ * fVar69) * fVar69 + fVar69;
    local_9a0 = (ulong)(fVar64 < 0.0) << 4;
    uVar24 = (ulong)(fVar66 < 0.0) << 4 | 0x20;
    uVar23 = (ulong)(fVar69 < 0.0) << 4 | 0x40;
    uVar25 = local_9a0 ^ 0x10;
    puVar21 = mm_lookupmask_ps;
    _local_8a8 = mm_lookupmask_ps._240_8_;
    _uStack_8a0 = mm_lookupmask_ps._248_8_;
    local_8b8 = fVar74;
    fStack_8b4 = fVar74;
    fStack_8b0 = fVar74;
    fStack_8ac = fVar74;
    local_8c8 = fVar77;
    fStack_8c4 = fVar77;
    fStack_8c0 = fVar77;
    fStack_8bc = fVar77;
    local_8d8 = fVar60;
    fStack_8d4 = fVar60;
    fStack_8d0 = fVar60;
    fStack_8cc = fVar60;
    local_8e8 = fVar69;
    fStack_8e4 = fVar69;
    fStack_8e0 = fVar69;
    fStack_8dc = fVar69;
    local_8f8 = fVar75;
    fStack_8f4 = fVar75;
    fStack_8f0 = fVar75;
    fStack_8ec = fVar75;
    local_908 = fVar76;
    fStack_904 = fVar76;
    fStack_900 = fVar76;
    fStack_8fc = fVar76;
    local_918 = fVar64;
    fStack_914 = fVar64;
    fStack_910 = fVar64;
    fStack_90c = fVar64;
    local_928 = fVar66;
    fStack_924 = fVar66;
    fStack_920 = fVar66;
    fStack_91c = fVar66;
    local_9d8 = context;
    fVar53 = fVar74;
    fVar27 = fVar74;
    fVar29 = fVar74;
    fVar30 = fVar77;
    fVar31 = fVar77;
    fVar34 = fVar77;
    fVar39 = fVar60;
    fVar40 = fVar60;
    fVar45 = fVar60;
    fVar46 = fVar69;
    fVar47 = fVar69;
    fVar48 = fVar69;
    fVar49 = fVar75;
    fVar50 = fVar75;
    fVar51 = fVar75;
    fVar54 = fVar76;
    fVar56 = fVar76;
    fVar58 = fVar76;
    fVar61 = fVar64;
    fVar62 = fVar64;
    fVar63 = fVar64;
    fVar67 = fVar66;
    fVar70 = fVar66;
    fVar72 = fVar66;
LAB_0068632a:
    if (local_998 != local_7d8) {
      uVar26 = local_998[-1];
      local_998 = local_998 + -1;
      do {
        fVar78 = *(float *)((long)&(This->collider).name + 4);
        do {
          if ((uVar26 & 8) != 0) {
            local_9a8 = (ulong)((uint)uVar26 & 0xf) - 8;
            uVar26 = uVar26 & 0xfffffffffffffff0;
            local_9b0 = 0;
            goto LAB_006864bc;
          }
          puVar21 = (undefined1 *)(uVar26 & 0xfffffffffffffff0);
          pfVar5 = (float *)(puVar21 + local_9a0 + 0x80);
          pfVar1 = (float *)(puVar21 + local_9a0 + 0x20);
          auVar36._0_4_ = ((*pfVar5 * fVar78 + *pfVar1) - fVar75) * fVar64;
          auVar36._4_4_ = ((pfVar5[1] * fVar78 + pfVar1[1]) - fVar49) * fVar61;
          auVar36._8_4_ = ((pfVar5[2] * fVar78 + pfVar1[2]) - fVar50) * fVar62;
          auVar36._12_4_ = ((pfVar5[3] * fVar78 + pfVar1[3]) - fVar51) * fVar63;
          auVar32._4_4_ = fVar39;
          auVar32._0_4_ = fVar60;
          auVar32._8_4_ = fVar40;
          auVar32._12_4_ = fVar45;
          auVar28 = maxps(auVar32,auVar36);
          pfVar5 = (float *)(puVar21 + uVar24 + 0x80);
          pfVar1 = (float *)(puVar21 + uVar24 + 0x20);
          auVar37._0_4_ = ((*pfVar5 * fVar78 + *pfVar1) - fVar76) * fVar66;
          auVar37._4_4_ = ((pfVar5[1] * fVar78 + pfVar1[1]) - fVar54) * fVar67;
          auVar37._8_4_ = ((pfVar5[2] * fVar78 + pfVar1[2]) - fVar56) * fVar70;
          auVar37._12_4_ = ((pfVar5[3] * fVar78 + pfVar1[3]) - fVar58) * fVar72;
          pfVar5 = (float *)(puVar21 + uVar23 + 0x80);
          pfVar1 = (float *)(puVar21 + uVar23 + 0x20);
          auVar41._0_4_ = ((*pfVar5 * fVar78 + *pfVar1) - fVar77) * fVar69;
          auVar41._4_4_ = ((pfVar5[1] * fVar78 + pfVar1[1]) - fVar30) * fVar46;
          auVar41._8_4_ = ((pfVar5[2] * fVar78 + pfVar1[2]) - fVar31) * fVar47;
          auVar41._12_4_ = ((pfVar5[3] * fVar78 + pfVar1[3]) - fVar34) * fVar48;
          auVar35 = maxps(auVar37,auVar41);
          auVar28 = maxps(auVar28,auVar35);
          pfVar5 = (float *)(puVar21 + uVar25 + 0x80);
          pfVar1 = (float *)(puVar21 + uVar25 + 0x20);
          auVar42._0_4_ = ((*pfVar5 * fVar78 + *pfVar1) - fVar75) * fVar64;
          auVar42._4_4_ = ((pfVar5[1] * fVar78 + pfVar1[1]) - fVar49) * fVar61;
          auVar42._8_4_ = ((pfVar5[2] * fVar78 + pfVar1[2]) - fVar50) * fVar62;
          auVar42._12_4_ = ((pfVar5[3] * fVar78 + pfVar1[3]) - fVar51) * fVar63;
          auVar38._4_4_ = fVar53;
          auVar38._0_4_ = fVar74;
          auVar38._8_4_ = fVar27;
          auVar38._12_4_ = fVar29;
          auVar35 = minps(auVar38,auVar42);
          pfVar5 = (float *)(puVar21 + (uVar24 ^ 0x10) + 0x80);
          pfVar1 = (float *)(puVar21 + (uVar24 ^ 0x10) + 0x20);
          auVar43._0_4_ = ((*pfVar5 * fVar78 + *pfVar1) - fVar76) * fVar66;
          auVar43._4_4_ = ((pfVar5[1] * fVar78 + pfVar1[1]) - fVar54) * fVar67;
          auVar43._8_4_ = ((pfVar5[2] * fVar78 + pfVar1[2]) - fVar56) * fVar70;
          auVar43._12_4_ = ((pfVar5[3] * fVar78 + pfVar1[3]) - fVar58) * fVar72;
          pfVar5 = (float *)(puVar21 + (uVar23 ^ 0x10) + 0x80);
          pfVar1 = (float *)(puVar21 + (uVar23 ^ 0x10) + 0x20);
          auVar20._4_4_ = ((pfVar5[1] * fVar78 + pfVar1[1]) - fVar30) * fVar46;
          auVar20._0_4_ = ((*pfVar5 * fVar78 + *pfVar1) - fVar77) * fVar69;
          auVar20._8_4_ = ((pfVar5[2] * fVar78 + pfVar1[2]) - fVar31) * fVar47;
          auVar20._12_4_ = ((pfVar5[3] * fVar78 + pfVar1[3]) - fVar34) * fVar48;
          auVar44 = minps(auVar43,auVar20);
          auVar35 = minps(auVar35,auVar44);
          bVar16 = auVar28._0_4_ <= auVar35._0_4_;
          bVar17 = auVar28._4_4_ <= auVar35._4_4_;
          bVar18 = auVar28._8_4_ <= auVar35._8_4_;
          bVar19 = auVar28._12_4_ <= auVar35._12_4_;
          if (((uint)uVar26 & 7) == 6) {
            bVar16 = (fVar78 < *(float *)(puVar21 + 0xf0) && *(float *)(puVar21 + 0xe0) <= fVar78)
                     && bVar16;
            bVar17 = (fVar78 < *(float *)(puVar21 + 0xf4) && *(float *)(puVar21 + 0xe4) <= fVar78)
                     && bVar17;
            bVar18 = (fVar78 < *(float *)(puVar21 + 0xf8) && *(float *)(puVar21 + 0xe8) <= fVar78)
                     && bVar18;
            bVar19 = (fVar78 < *(float *)(puVar21 + 0xfc) && *(float *)(puVar21 + 0xec) <= fVar78)
                     && bVar19;
          }
          auVar33._0_4_ = (uint)bVar16 * -0x80000000;
          auVar33._4_4_ = (uint)bVar17 * -0x80000000;
          auVar33._8_4_ = (uint)bVar18 * -0x80000000;
          auVar33._12_4_ = (uint)bVar19 * -0x80000000;
          uVar22 = movmskps((int)local_9d8,auVar33);
          local_9d8 = (RayQueryContext *)(ulong)uVar22;
          if (uVar22 == 0) goto LAB_0068632a;
          lVar15 = 0;
          if ((byte)uVar22 != 0) {
            for (; ((byte)uVar22 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          uVar26 = *(ulong *)(puVar21 + lVar15 * 8);
          uVar22 = (uVar22 & 0xff) - 1 & uVar22 & 0xff;
          local_9d8 = (RayQueryContext *)(ulong)uVar22;
        } while (uVar22 == 0);
        do {
          *local_998 = uVar26;
          local_998 = local_998 + 1;
          lVar15 = 0;
          if (local_9d8 != (RayQueryContext *)0x0) {
            for (; ((ulong)local_9d8 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
            }
          }
          uVar26 = *(ulong *)(puVar21 + lVar15 * 8);
          local_9d8 = (RayQueryContext *)((ulong)((long)&local_9d8[-1].args + 7) & (ulong)local_9d8)
          ;
        } while (local_9d8 != (RayQueryContext *)0x0);
      } while( true );
    }
  }
  return;
LAB_006864bc:
  if (local_9b0 == local_9a8) goto LAB_0068632a;
  local_9d8 = (RayQueryContext *)(local_9b0 * 0x140);
  fVar74 = *(float *)((long)&(This->collider).name + 4);
  pfVar5 = (float *)((long)&local_9d8[6].scene + uVar26);
  pfVar1 = (float *)((long)&local_9d8->scene + uVar26);
  fVar34 = *pfVar5 * fVar74 + *pfVar1;
  fVar39 = pfVar5[1] * fVar74 + pfVar1[1];
  fStack_9f0 = pfVar5[2] * fVar74 + pfVar1[2];
  fStack_9ec = pfVar5[3] * fVar74 + pfVar1[3];
  pfVar5 = (float *)((long)&local_9d8[6].args + uVar26);
  pfVar1 = (float *)((long)&local_9d8->args + uVar26);
  fVar78 = *pfVar5 * fVar74 + *pfVar1;
  fVar80 = pfVar5[1] * fVar74 + pfVar1[1];
  fVar82 = pfVar5[2] * fVar74 + pfVar1[2];
  fVar84 = pfVar5[3] * fVar74 + pfVar1[3];
  pfVar5 = (float *)((long)&local_9d8[7].user + uVar26);
  pfVar1 = (float *)((long)&local_9d8[1].user + uVar26);
  fVar40 = *pfVar5 * fVar74 + *pfVar1;
  fVar45 = pfVar5[1] * fVar74 + pfVar1[1];
  fVar69 = pfVar5[2] * fVar74 + pfVar1[2];
  fVar46 = pfVar5[3] * fVar74 + pfVar1[3];
  pfVar6 = (float *)((long)&local_9d8[8].scene + uVar26);
  pfVar1 = (float *)((long)&local_9d8[2].scene + uVar26);
  pfVar7 = (float *)((long)&local_9d8[8].args + uVar26);
  pfVar5 = (float *)((long)&local_9d8[2].args + uVar26);
  pfVar8 = (float *)((long)&local_9d8[9].user + uVar26);
  pfVar2 = (float *)((long)&local_9d8[3].user + uVar26);
  pfVar9 = (float *)((long)&local_9d8[10].scene + uVar26);
  pfVar3 = (float *)((long)&local_9d8[4].scene + uVar26);
  pfVar10 = (float *)((long)&local_9d8[10].args + uVar26);
  pfVar4 = (float *)((long)&local_9d8[4].args + uVar26);
  pfVar11 = (float *)((long)&local_9d8[0xb].user + uVar26);
  pfVar12 = (float *)((long)&local_9d8[5].user + uVar26);
  fVar66 = fVar34 - (*pfVar6 * fVar74 + *pfVar1);
  fVar67 = fVar39 - (pfVar6[1] * fVar74 + pfVar1[1]);
  fVar70 = fStack_9f0 - (pfVar6[2] * fVar74 + pfVar1[2]);
  fVar72 = fStack_9ec - (pfVar6[3] * fVar74 + pfVar1[3]);
  fVar47 = fVar78 - (*pfVar7 * fVar74 + *pfVar5);
  fVar48 = fVar80 - (pfVar7[1] * fVar74 + pfVar5[1]);
  fVar49 = fVar82 - (pfVar7[2] * fVar74 + pfVar5[2]);
  fVar50 = fVar84 - (pfVar7[3] * fVar74 + pfVar5[3]);
  fVar86 = fVar40 - (*pfVar8 * fVar74 + *pfVar2);
  fVar87 = fVar45 - (pfVar8[1] * fVar74 + pfVar2[1]);
  fVar88 = fVar69 - (pfVar8[2] * fVar74 + pfVar2[2]);
  fVar89 = fVar46 - (pfVar8[3] * fVar74 + pfVar2[3]);
  fVar27 = (*pfVar9 * fVar74 + *pfVar3) - fVar34;
  fVar29 = (pfVar9[1] * fVar74 + pfVar3[1]) - fVar39;
  fVar30 = (pfVar9[2] * fVar74 + pfVar3[2]) - fStack_9f0;
  fVar31 = (pfVar9[3] * fVar74 + pfVar3[3]) - fStack_9ec;
  fVar64 = (*pfVar10 * fVar74 + *pfVar4) - fVar78;
  fVar61 = (pfVar10[1] * fVar74 + pfVar4[1]) - fVar80;
  fVar62 = (pfVar10[2] * fVar74 + pfVar4[2]) - fVar82;
  fVar63 = (pfVar10[3] * fVar74 + pfVar4[3]) - fVar84;
  fVar51 = (fVar74 * *pfVar11 + *pfVar12) - fVar40;
  fVar54 = (fVar74 * pfVar11[1] + pfVar12[1]) - fVar45;
  fVar56 = (fVar74 * pfVar11[2] + pfVar12[2]) - fVar69;
  fVar58 = (fVar74 * pfVar11[3] + pfVar12[3]) - fVar46;
  local_808._0_4_ = fVar86 * fVar64 - fVar47 * fVar51;
  local_808._4_4_ = fVar87 * fVar61 - fVar48 * fVar54;
  local_808._8_4_ = fVar88 * fVar62 - fVar49 * fVar56;
  local_808._12_4_ = fVar89 * fVar63 - fVar50 * fVar58;
  fVar74 = *(float *)&This->ptr;
  fVar75 = *(float *)((long)&This->ptr + 4);
  fVar76 = *(float *)&This->leafIntersector;
  fVar77 = *(float *)&(This->collider).collide;
  fVar53 = *(float *)((long)&(This->collider).collide + 4);
  fVar60 = *(float *)&(This->collider).name;
  fVar34 = fVar34 - fVar74;
  fVar39 = fVar39 - fVar74;
  fStack_9f0 = fStack_9f0 - fVar74;
  fStack_9ec = fStack_9ec - fVar74;
  fVar78 = fVar78 - fVar75;
  fVar80 = fVar80 - fVar75;
  fVar82 = fVar82 - fVar75;
  fVar84 = fVar84 - fVar75;
  fVar94 = fVar34 * fVar53 - fVar78 * fVar77;
  fVar95 = fVar39 * fVar53 - fVar80 * fVar77;
  fVar96 = fStack_9f0 * fVar53 - fVar82 * fVar77;
  fVar97 = fStack_9ec * fVar53 - fVar84 * fVar77;
  local_7f8[0] = fVar66 * fVar51 - fVar86 * fVar27;
  local_7f8[1] = fVar67 * fVar54 - fVar87 * fVar29;
  local_7f8[2] = fVar70 * fVar56 - fVar88 * fVar30;
  local_7f8[3] = fVar72 * fVar58 - fVar89 * fVar31;
  fVar40 = fVar40 - fVar76;
  fVar45 = fVar45 - fVar76;
  fVar69 = fVar69 - fVar76;
  fVar46 = fVar46 - fVar76;
  local_9f8 = (undefined1 *)CONCAT44(fVar39,fVar34);
  fVar90 = fVar40 * fVar77 - fVar34 * fVar60;
  fVar91 = fVar45 * fVar77 - fVar39 * fVar60;
  fVar92 = fVar69 * fVar77 - fStack_9f0 * fVar60;
  fVar93 = fVar46 * fVar77 - fStack_9ec * fVar60;
  local_7e8[0] = fVar47 * fVar27 - fVar66 * fVar64;
  local_7e8[1] = fVar48 * fVar29 - fVar67 * fVar61;
  local_7e8[2] = fVar49 * fVar30 - fVar70 * fVar62;
  local_7e8[3] = fVar50 * fVar31 - fVar72 * fVar63;
  fVar79 = fVar78 * fVar60 - fVar40 * fVar53;
  fVar81 = fVar80 * fVar60 - fVar45 * fVar53;
  fVar83 = fVar82 * fVar60 - fVar69 * fVar53;
  fVar85 = fVar84 * fVar60 - fVar46 * fVar53;
  local_9c8 = local_808;
  fVar74 = fVar77 * local_808._0_4_ + fVar53 * local_7f8[0] + fVar60 * local_7e8[0];
  fVar75 = fVar77 * local_808._4_4_ + fVar53 * local_7f8[1] + fVar60 * local_7e8[1];
  fVar76 = fVar77 * local_808._8_4_ + fVar53 * local_7f8[2] + fVar60 * local_7e8[2];
  fVar77 = fVar77 * local_808._12_4_ + fVar53 * local_7f8[3] + fVar60 * local_7e8[3];
  uVar52 = (uint)fVar74 & 0x80000000;
  uVar55 = (uint)fVar75 & 0x80000000;
  uVar57 = (uint)fVar76 & 0x80000000;
  uVar59 = (uint)fVar77 & 0x80000000;
  local_898 = (float)((uint)(fVar27 * fVar79 + fVar64 * fVar90 + fVar51 * fVar94) ^ uVar52);
  fStack_894 = (float)((uint)(fVar29 * fVar81 + fVar61 * fVar91 + fVar54 * fVar95) ^ uVar55);
  fStack_890 = (float)((uint)(fVar30 * fVar83 + fVar62 * fVar92 + fVar56 * fVar96) ^ uVar57);
  fStack_88c = (float)((uint)(fVar31 * fVar85 + fVar63 * fVar93 + fVar58 * fVar97) ^ uVar59);
  local_888 = (float)((uint)(fVar79 * fVar66 + fVar90 * fVar47 + fVar94 * fVar86) ^ uVar52);
  fStack_884 = (float)((uint)(fVar81 * fVar67 + fVar91 * fVar48 + fVar95 * fVar87) ^ uVar55);
  fStack_880 = (float)((uint)(fVar83 * fVar70 + fVar92 * fVar49 + fVar96 * fVar88) ^ uVar57);
  fStack_87c = (float)((uint)(fVar85 * fVar72 + fVar93 * fVar50 + fVar97 * fVar89) ^ uVar59);
  local_868 = ABS(fVar74);
  fStack_864 = ABS(fVar75);
  fStack_860 = ABS(fVar76);
  fStack_85c = ABS(fVar77);
  uVar65 = -(uint)(local_898 + local_888 <= local_868) &
           -(uint)((0.0 <= local_888 && 0.0 <= local_898) && fVar74 != 0.0) & local_8a8;
  uVar68 = -(uint)(fStack_894 + fStack_884 <= fStack_864) &
           -(uint)((0.0 <= fStack_884 && 0.0 <= fStack_894) && fVar75 != 0.0) & uStack_8a4;
  uVar71 = -(uint)(fStack_890 + fStack_880 <= fStack_860) &
           -(uint)((0.0 <= fStack_880 && 0.0 <= fStack_890) && fVar76 != 0.0) & uStack_8a0;
  uVar73 = -(uint)(fStack_88c + fStack_87c <= fStack_85c) &
           -(uint)((0.0 <= fStack_87c && 0.0 <= fStack_88c) && fVar77 != 0.0) & uStack_89c;
  auVar35._4_4_ = uVar68;
  auVar35._0_4_ = uVar65;
  auVar35._8_4_ = uVar71;
  auVar35._12_4_ = uVar73;
  uVar22 = movmskps((int)puVar21,auVar35);
  local_9f8 = (undefined1 *)(ulong)uVar22;
  if (uVar22 != 0) {
    local_878 = (float)(uVar52 ^ (uint)(fVar34 * local_808._0_4_ +
                                       fVar78 * local_7f8[0] + fVar40 * local_7e8[0]));
    fStack_874 = (float)(uVar55 ^ (uint)(fVar39 * local_808._4_4_ +
                                        fVar80 * local_7f8[1] + fVar45 * local_7e8[1]));
    fStack_870 = (float)(uVar57 ^ (uint)(fStack_9f0 * local_808._8_4_ +
                                        fVar82 * local_7f8[2] + fVar69 * local_7e8[2]));
    fStack_86c = (float)(uVar59 ^ (uint)(fStack_9ec * local_808._12_4_ +
                                        fVar84 * local_7f8[3] + fVar46 * local_7e8[3]));
    fVar74 = *(float *)((long)&This->leafIntersector + 4);
    fVar75 = *(float *)&(This->intersector1).intersect;
    local_848._0_4_ =
         -(uint)(local_878 <= fVar75 * local_868 && fVar74 * local_868 < local_878) & uVar65;
    local_848._4_4_ =
         -(uint)(fStack_874 <= fVar75 * fStack_864 && fVar74 * fStack_864 < fStack_874) & uVar68;
    local_848._8_4_ =
         -(uint)(fStack_870 <= fVar75 * fStack_860 && fVar74 * fStack_860 < fStack_870) & uVar71;
    local_848._12_4_ =
         -(uint)(fStack_86c <= fVar75 * fStack_85c && fVar74 * fStack_85c < fStack_86c) & uVar73;
    uVar22 = movmskps((int)ray,local_848);
    ray = (Ray *)(ulong)uVar22;
    if (uVar22 != 0) {
      local_9c8._8_8_ = local_808._8_8_;
      local_9c8._0_8_ = *(undefined8 *)&(local_9d0->org).field_0;
      auVar44._4_4_ = fStack_864;
      auVar44._0_4_ = local_868;
      auVar44._8_4_ = fStack_860;
      auVar44._12_4_ = fStack_85c;
      auVar28 = rcpps(local_808,auVar44);
      fVar74 = auVar28._0_4_;
      fVar75 = auVar28._4_4_;
      fVar76 = auVar28._8_4_;
      fVar77 = auVar28._12_4_;
      fVar74 = (1.0 - local_868 * fVar74) * fVar74 + fVar74;
      fVar75 = (1.0 - fStack_864 * fVar75) * fVar75 + fVar75;
      fVar76 = (1.0 - fStack_860 * fVar76) * fVar76 + fVar76;
      fVar77 = (1.0 - fStack_85c * fVar77) * fVar77 + fVar77;
      local_818[0] = local_878 * fVar74;
      local_818[1] = fStack_874 * fVar75;
      local_818[2] = fStack_870 * fVar76;
      local_818[3] = fStack_86c * fVar77;
      local_838[0] = local_898 * fVar74;
      local_838[1] = fStack_894 * fVar75;
      local_838[2] = fStack_890 * fVar76;
      local_838[3] = fStack_88c * fVar77;
      local_828._0_4_ = fVar74 * local_888;
      local_828._4_4_ = fVar75 * fStack_884;
      local_828._8_4_ = fVar76 * fStack_880;
      local_828._12_4_ = fVar77 * fStack_87c;
      local_990 = (ulong)(byte)uVar22;
      local_9d8 = (RayQueryContext *)((long)&local_9d8->scene + uVar26);
      do {
        local_9f8 = (undefined1 *)0x0;
        if (local_990 != 0) {
          for (; (local_990 >> (long)local_9f8 & 1) == 0; local_9f8 = local_9f8 + 1) {
          }
        }
        local_970 = *(uint *)((long)&local_9d8[0xc].scene + (long)local_9f8 * 4);
        local_9b8 = *(long *)(*(long *)(local_9c8._0_8_ + 0x1e8) + (ulong)local_970 * 8);
        if ((*(uint *)(local_9b8 + 0x34) & *(uint *)((long)&(This->intersector1).intersect + 4)) ==
            0) {
          local_990 = local_990 ^ 1L << ((ulong)local_9f8 & 0x3f);
        }
        else {
          local_9e0 = *(byte **)&(local_9d0->dir).field_0;
          if ((*(long *)(local_9e0 + 0x10) == 0) && (*(long *)(local_9b8 + 0x48) == 0)) {
LAB_00686a42:
            *(undefined4 *)&(This->intersector1).intersect = 0xff800000;
            return;
          }
          local_948 = *(undefined4 **)((long)&(local_9d0->org).field_0 + 8);
          local_988 = local_7f8[(long)(local_9f8 + -4)];
          local_984 = local_7f8[(long)local_9f8];
          local_980 = local_7e8[(long)local_9f8];
          local_97c = local_838[(long)local_9f8];
          local_978 = local_818[(long)(local_9f8 + -4)];
          local_974 = *(undefined4 *)((long)&local_9d8[0xc].args + (long)local_9f8 * 4);
          local_96c = *local_948;
          local_968 = local_948[1];
          uVar13 = *(undefined4 *)&(This->intersector1).intersect;
          *(float *)&(This->intersector1).intersect = local_818[(long)local_9f8];
          local_9fc = -1;
          local_958 = &local_9fc;
          local_950 = *(undefined8 *)(local_9b8 + 0x18);
          local_938 = &local_988;
          local_930 = 1;
          local_940 = This;
          if (((*(code **)(local_9b8 + 0x48) == (code *)0x0) ||
              ((**(code **)(local_9b8 + 0x48))(&local_958), *local_958 != 0)) &&
             ((*(code **)(local_9e0 + 0x10) == (code *)0x0 ||
              ((((*local_9e0 & 2) == 0 && ((*(byte *)(local_9b8 + 0x3e) & 0x40) == 0)) ||
               ((**(code **)(local_9e0 + 0x10))(&local_958), *local_958 != 0))))))
          goto LAB_00686a42;
          *(undefined4 *)&(This->intersector1).intersect = uVar13;
          local_990 = local_990 ^ 1L << ((ulong)local_9f8 & 0x3f);
        }
      } while (local_990 != 0);
      ray = (Ray *)0x0;
    }
  }
  local_9b0 = local_9b0 + 1;
  puVar21 = local_9f8;
  fVar74 = local_8b8;
  fVar53 = fStack_8b4;
  fVar27 = fStack_8b0;
  fVar29 = fStack_8ac;
  fVar77 = local_8c8;
  fVar30 = fStack_8c4;
  fVar31 = fStack_8c0;
  fVar34 = fStack_8bc;
  fVar60 = local_8d8;
  fVar39 = fStack_8d4;
  fVar40 = fStack_8d0;
  fVar45 = fStack_8cc;
  fVar69 = local_8e8;
  fVar46 = fStack_8e4;
  fVar47 = fStack_8e0;
  fVar48 = fStack_8dc;
  fVar75 = local_8f8;
  fVar49 = fStack_8f4;
  fVar50 = fStack_8f0;
  fVar51 = fStack_8ec;
  fVar76 = local_908;
  fVar54 = fStack_904;
  fVar56 = fStack_900;
  fVar58 = fStack_8fc;
  fVar64 = local_918;
  fVar61 = fStack_914;
  fVar62 = fStack_910;
  fVar63 = fStack_90c;
  fVar66 = local_928;
  fVar67 = fStack_924;
  fVar70 = fStack_920;
  fVar72 = fStack_91c;
  goto LAB_006864bc;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }